

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::MultiTexShader::shadeFragments
          (MultiTexShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  FragmentPacket *packet_00;
  float fVar5;
  float fVar6;
  Vector<float,_4> *local_2c0;
  int local_2b0;
  int fragNdx_1;
  int local_29c;
  int fragNdx;
  Vector<float,_3> local_28c;
  Vector<float,_3> local_280;
  Vector<float,_3> local_274;
  undefined1 local_268 [8];
  Vec3 transformedTexCoords_1 [4];
  Vector<float,_3> local_22c;
  VecAccess<float,_3,_2> local_220;
  Vector<float,_3> local_210;
  Vector<float,_3> local_204;
  VecAccess<float,_3,_2> local_1f8;
  Vector<float,_3> local_1e8;
  Vector<float,_3> local_1dc;
  VecAccess<float,_3,_2> local_1d0;
  Vector<float,_3> local_1c0;
  Vector<float,_3> local_1b4;
  VecAccess<float,_3,_2> local_1a8;
  Vec2 local_198;
  Vec2 transformedTexCoords [4];
  Vector<float,_4> local_158;
  VecAccess<float,_4,_2> local_148;
  Vector<float,_4> local_138;
  VecAccess<float,_4,_2> local_128;
  Vector<float,_4> local_118;
  VecAccess<float,_4,_2> local_108;
  Vector<float,_2> local_f8;
  Vec2 texCoords [4];
  Vec4 texSamples [4];
  int local_8c;
  undefined1 local_88 [4];
  int unitNdx;
  Vec4 outColors [4];
  float colorMultiplier;
  FragmentPacket *packet;
  int packetNdx;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  MultiTexShader *this_local;
  
  for (packet._4_4_ = 0; packet._4_4_ < numPackets; packet._4_4_ = packet._4_4_ + 1) {
    packet_00 = packets + packet._4_4_;
    iVar1 = *(int *)&(this->super_ShaderProgram).field_0x154;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_88,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(outColors[0].m_data + 2),0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(outColors[1].m_data + 2),0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(outColors[2].m_data + 2),0.0);
    for (local_8c = 0; local_8c < *(int *)&(this->super_ShaderProgram).field_0x154;
        local_8c = local_8c + 1) {
      local_2c0 = (Vector<float,_4> *)(texCoords + 3);
      do {
        tcu::Vector<float,_4>::Vector(local_2c0);
        local_2c0 = local_2c0 + 1;
      } while (local_2c0 != (Vector<float,_4> *)(texSamples[3].m_data + 2));
      rr::readTriangleVarying<float>((rr *)&local_118,packet_00,context,0,0);
      local_108 = tcu::Vector<float,_4>::xy(&local_118);
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&local_f8);
      rr::readTriangleVarying<float>((rr *)&local_138,packet_00,context,0,1);
      local_128 = tcu::Vector<float,_4>::xy(&local_138);
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)texCoords);
      rr::readTriangleVarying<float>((rr *)&local_158,packet_00,context,0,2);
      local_148 = tcu::Vector<float,_4>::xy(&local_158);
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)(texCoords + 1));
      rr::readTriangleVarying<float>((rr *)(transformedTexCoords + 3),packet_00,context,0,3);
      tcu::Vector<float,_4>::xy((Vector<float,_4> *)(transformedTexCoords + 3));
      tcu::VecAccess::operator_cast_to_Vector((VecAccess *)(texCoords + 2));
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_unitTypes,(long)local_8c);
      if (*pvVar2 == 0xde1) {
        pvVar3 = std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::
                 operator[](&this->m_transformations,(long)local_8c);
        fVar5 = tcu::Vector<float,_2>::x(&local_f8);
        fVar6 = tcu::Vector<float,_2>::y(&local_f8);
        tcu::Vector<float,_3>::Vector(&local_1c0,fVar5,fVar6,1.0);
        tcu::operator*((tcu *)&local_1b4,pvVar3,&local_1c0);
        local_1a8 = tcu::Vector<float,_3>::xy(&local_1b4);
        tcu::VecAccess::operator_cast_to_Vector((VecAccess *)&local_198);
        pvVar3 = std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::
                 operator[](&this->m_transformations,(long)local_8c);
        fVar5 = tcu::Vector<float,_2>::x(texCoords);
        fVar6 = tcu::Vector<float,_2>::y(texCoords);
        tcu::Vector<float,_3>::Vector(&local_1e8,fVar5,fVar6,1.0);
        tcu::operator*((tcu *)&local_1dc,pvVar3,&local_1e8);
        local_1d0 = tcu::Vector<float,_3>::xy(&local_1dc);
        tcu::VecAccess::operator_cast_to_Vector((VecAccess *)transformedTexCoords);
        pvVar3 = std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::
                 operator[](&this->m_transformations,(long)local_8c);
        fVar5 = tcu::Vector<float,_2>::x(texCoords + 1);
        fVar6 = tcu::Vector<float,_2>::y(texCoords + 1);
        tcu::Vector<float,_3>::Vector(&local_210,fVar5,fVar6,1.0);
        tcu::operator*((tcu *)&local_204,pvVar3,&local_210);
        local_1f8 = tcu::Vector<float,_3>::xy(&local_204);
        tcu::VecAccess::operator_cast_to_Vector((VecAccess *)(transformedTexCoords + 1));
        pvVar3 = std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::
                 operator[](&this->m_transformations,(long)local_8c);
        fVar5 = tcu::Vector<float,_2>::x(texCoords + 2);
        fVar6 = tcu::Vector<float,_2>::y(texCoords + 2);
        tcu::Vector<float,_3>::Vector
                  ((Vector<float,_3> *)(transformedTexCoords_1[3].m_data + 1),fVar5,fVar6,1.0);
        tcu::operator*((tcu *)&local_22c,pvVar3,
                       (Vector<float,_3> *)(transformedTexCoords_1[3].m_data + 1));
        local_220 = tcu::Vector<float,_3>::xy(&local_22c);
        tcu::VecAccess::operator_cast_to_Vector((VecAccess *)(transformedTexCoords + 2));
        pvVar4 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                           (&(this->super_ShaderProgram).m_uniforms,(long)(local_8c << 1));
        sglr::rc::Texture2D::sample4((pvVar4->sampler).tex2D,(Vec4 *)(texCoords + 3),&local_198,0.0)
        ;
      }
      else {
        pvVar3 = std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::
                 operator[](&this->m_transformations,(long)local_8c);
        fVar5 = tcu::Vector<float,_2>::x(&local_f8);
        fVar6 = tcu::Vector<float,_2>::y(&local_f8);
        tcu::Vector<float,_3>::Vector(&local_274,fVar5,fVar6,1.0);
        tcu::operator*((tcu *)local_268,pvVar3,&local_274);
        pvVar3 = std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::
                 operator[](&this->m_transformations,(long)local_8c);
        fVar5 = tcu::Vector<float,_2>::x(texCoords);
        fVar6 = tcu::Vector<float,_2>::y(texCoords);
        tcu::Vector<float,_3>::Vector(&local_280,fVar5,fVar6,1.0);
        tcu::operator*((tcu *)(transformedTexCoords_1[0].m_data + 1),pvVar3,&local_280);
        pvVar3 = std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::
                 operator[](&this->m_transformations,(long)local_8c);
        fVar5 = tcu::Vector<float,_2>::x(texCoords + 1);
        fVar6 = tcu::Vector<float,_2>::y(texCoords + 1);
        tcu::Vector<float,_3>::Vector(&local_28c,fVar5,fVar6,1.0);
        tcu::operator*((tcu *)(transformedTexCoords_1[1].m_data + 1),pvVar3,&local_28c);
        pvVar3 = std::vector<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>::
                 operator[](&this->m_transformations,(long)local_8c);
        fVar5 = tcu::Vector<float,_2>::x(texCoords + 2);
        fVar6 = tcu::Vector<float,_2>::y(texCoords + 2);
        tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&stack0xfffffffffffffd68,fVar5,fVar6,1.0);
        tcu::operator*((tcu *)(transformedTexCoords_1[2].m_data + 1),pvVar3,
                       (Vector<float,_3> *)&stack0xfffffffffffffd68);
        pvVar4 = std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::operator[]
                           (&(this->super_ShaderProgram).m_uniforms,(long)(local_8c << 1));
        sglr::rc::TextureCube::sample4
                  ((pvVar4->sampler).texCube,(Vec4 *)(texCoords + 3),(Vec3 *)local_268,0.0);
      }
      for (local_29c = 0; local_29c < 4; local_29c = local_29c + 1) {
        tcu::operator*((tcu *)&stack0xfffffffffffffd54,1.0 / (float)iVar1,
                       (Vector<float,_4> *)(texSamples[(long)local_29c + -1].m_data + 2));
        tcu::Vector<float,_4>::operator+=
                  ((Vector<float,_4> *)(local_88 + (long)local_29c * 0x10),
                   (Vector<float,_4> *)&stack0xfffffffffffffd54);
      }
    }
    for (local_2b0 = 0; local_2b0 < 4; local_2b0 = local_2b0 + 1) {
      rr::writeFragmentOutput<tcu::Vector<float,4>>
                (context,packet._4_4_,local_2b0,0,
                 (Vector<float,_4> *)(local_88 + (long)local_2b0 * 0x10));
    }
  }
  return;
}

Assistant:

void MultiTexShader::shadeFragments	(rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	DE_ASSERT((int)m_unitTypes.size() == m_numUnits);
	DE_ASSERT((int)m_transformations.size() == m_numUnits);
	DE_ASSERT((int)m_lodDerivateParts.size() == m_numUnits);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::FragmentPacket& packet				= packets[packetNdx];
		const float			colorMultiplier		= 1.0f / (float)m_numUnits;
		Vec4				outColors[4]		= { Vec4(0.0f), Vec4(0.0f), Vec4(0.0f), Vec4(0.0f) };

		for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
		{
			tcu::Vec4 texSamples[4];

			// Read tex coords
			const tcu::Vec2 texCoords[4] =
			{
				rr::readTriangleVarying<float>(packet, context, 0, 0).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 1).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 2).xy(),
				rr::readTriangleVarying<float>(packet, context, 0, 3).xy(),
			};

			if (m_unitTypes[unitNdx] == GL_TEXTURE_2D)
			{
				// Transform
				const tcu::Vec2 transformedTexCoords[4] =
				{
					(m_transformations[unitNdx] * Vec3(texCoords[0].x(), texCoords[0].y(), 1.0f)).xy(),
					(m_transformations[unitNdx] * Vec3(texCoords[1].x(), texCoords[1].y(), 1.0f)).xy(),
					(m_transformations[unitNdx] * Vec3(texCoords[2].x(), texCoords[2].y(), 1.0f)).xy(),
					(m_transformations[unitNdx] * Vec3(texCoords[3].x(), texCoords[3].y(), 1.0f)).xy(),
				};

				// Sample
				m_uniforms[2*unitNdx].sampler.tex2D->sample4(texSamples, transformedTexCoords);
			}
			else
			{
				DE_ASSERT(m_unitTypes[unitNdx] == GL_TEXTURE_CUBE_MAP);

				// Transform
				const tcu::Vec3 transformedTexCoords[4] =
				{
					m_transformations[unitNdx] * Vec3(texCoords[0].x(), texCoords[0].y(), 1.0f),
					m_transformations[unitNdx] * Vec3(texCoords[1].x(), texCoords[1].y(), 1.0f),
					m_transformations[unitNdx] * Vec3(texCoords[2].x(), texCoords[2].y(), 1.0f),
					m_transformations[unitNdx] * Vec3(texCoords[3].x(), texCoords[3].y(), 1.0f),
				};

				// Sample
				m_uniforms[2*unitNdx].sampler.texCube->sample4(texSamples, transformedTexCoords);
			}

			// Add to sum
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				outColors[fragNdx] += colorMultiplier * texSamples[fragNdx];
		}

		// output
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, outColors[fragNdx]);
	}
}